

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,int ReqNew)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pFanin;
  int ReqNew_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ObjIsConst1(pObj);
  if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsCi(pObj), iVar1 == 0)) {
    iVar1 = Ivy_ObjIsNode(pObj);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsBuf(pObj), iVar1 == 0)) {
      __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                    ,0x1c1,"void Ivy_ObjUpdateLevelR_rec(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    pIVar2 = Ivy_ObjFanin0(pObj);
    iVar1 = Vec_IntEntry(p->vRequired,pIVar2->Id);
    if (ReqNew + -1 < iVar1) {
      Vec_IntWriteEntry(p->vRequired,pIVar2->Id,ReqNew + -1);
      Ivy_ObjUpdateLevelR_rec(p,pIVar2,ReqNew + -1);
    }
    iVar1 = Ivy_ObjIsBuf(pObj);
    if (iVar1 == 0) {
      pIVar2 = Ivy_ObjFanin1(pObj);
      iVar1 = Vec_IntEntry(p->vRequired,pIVar2->Id);
      if (ReqNew + -1 < iVar1) {
        Vec_IntWriteEntry(p->vRequired,pIVar2->Id,ReqNew + -1);
        Ivy_ObjUpdateLevelR_rec(p,pIVar2,ReqNew + -1);
      }
    }
  }
  return;
}

Assistant:

void Ivy_ObjUpdateLevelR_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, int ReqNew )
{
    Ivy_Obj_t * pFanin;
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
        return;
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    // process the first fanin
    pFanin = Ivy_ObjFanin0(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
    if ( Ivy_ObjIsBuf(pObj) )
        return;
    // process the second fanin
    pFanin = Ivy_ObjFanin1(pObj);
    if ( Vec_IntEntry(p->vRequired, pFanin->Id) > ReqNew - 1 )
    {
        Vec_IntWriteEntry( p->vRequired, pFanin->Id, ReqNew - 1 );
        Ivy_ObjUpdateLevelR_rec( p, pFanin, ReqNew - 1 );
    }
}